

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

int ON_SearchMonotoneArray(double *array,int length,double t)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  double *pdVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  double *pdVar11;
  
  uVar6 = 0xfffffffe;
  if ((0 < length && array != (double *)0x0) && (uVar6 = 0xffffffff, *array <= t)) {
    bVar3 = array[length - 1U] <= t;
    if (bVar3) {
      uVar6 = length - 1U;
      if (bVar3 && t != array[length - 1U]) {
        uVar6 = length;
      }
    }
    else {
      uVar6 = 0;
      if (array[1] <= t) {
        if (array[(long)length + -2] <= t) {
          return length + -2;
        }
        uVar5 = 0;
        do {
          uVar8 = uVar5;
          uVar5 = uVar8 + 1;
        } while (array[uVar8] == array[uVar8 + 1]);
        pdVar11 = array + (uint)length;
        do {
          pdVar7 = pdVar11 + -1;
          length = length + -1;
          pdVar1 = pdVar11 + -2;
          pdVar11 = pdVar7;
        } while (*pdVar7 == *pdVar1);
        uVar6 = (uint)uVar8;
        if ((int)(uVar8 + 1) < length) {
          do {
            iVar9 = length + (int)uVar8 >> 1;
            lVar10 = (long)iVar9;
            if (array[lVar10] <= t) {
              uVar8 = (ulong)(iVar9 - 1);
              pdVar11 = array + lVar10 + 1;
              do {
                pdVar1 = pdVar11 + -1;
                uVar8 = (ulong)((int)uVar8 + 1);
                dVar2 = *pdVar11;
                pdVar11 = pdVar11 + 1;
              } while (*pdVar1 == dVar2);
            }
            else {
              do {
                pdVar11 = array + lVar10;
                lVar4 = lVar10 + -1;
                lVar10 = lVar10 + -1;
              } while (*pdVar11 == array[lVar4]);
              length = (int)lVar10 + 1;
            }
            uVar6 = (uint)uVar8;
          } while ((int)(uVar6 + 1) < length);
        }
      }
    }
  }
  return uVar6;
}

Assistant:

int 
ON_SearchMonotoneArray(const double* array, int length, double t)
/*****************************************************************************
Find interval in an increasing array of doubles
 
INPUT:
  array
    A monotone increasing (array[i] <= array[i+1]) array of length doubles.
  length (>=1)
    number of doubles in array
  t
    parameter
OUTPUT:
  ON_GetdblArrayIndex()
    -1:         t < array[0]
     i:         (0 <= i <= length-2) array[i] <= t < array[i+1]
     length-1:  t == array[length-1]
     length:    t  > array[length-1]
COMMENTS:
  If length < 1 or array is not monotone increasing, you will get a meaningless
  answer and may crash your program.
EXAMPLE:
  // Given a "t", find the knots that define the span used to evaluate a
  // nurb at t; i.e., find "i" so that
  // knot[i] <= ... <= knot[i+order-2] 
  //   <= t < knot[i+order-1] <= ... <= knot[i+2*(order-1)-1]
  i = ON_GetdblArrayIndex(knot+order-2,cv_count-order+2,t);
  if (i < 0) i = 0; else if (i > cv_count - order) i = cv_count - order;
RELATED FUNCTIONS:
  ON_
  ON_
*****************************************************************************/

{                 
  int 
    i, i0, i1;

  if (0 == array || length < 1)
    return -2; // check for empty input to prevent crashes RH-23451

  length--;

  /* Since t is frequently near the ends and bisection takes the
   * longest near the ends, trap those cases here.
   */
  if (t < array[0]) 
    return -1;
  if (t >= array[length])
    return (t > array[length]) ? length+1 : length;
  if (t < array[1])
    return 0;
  if (t >= array[length-1])
    return (length-1);


  i0 = 0;
  i1 = length;
  while (array[i0] == array[i0+1]) i0++;
  while (array[i1] == array[i1-1]) i1--;
  /* From now on we have 
   *  1.) array[i0] <= t < array[i1] 
   *  2.) i0 <= i < i1.
   * When i0+1 == i1, we have array[i0] <= t < array[i0+1] 
   * and i0 is the answer we seek.
   */
  while (i0+1 < i1) {
    i = (i0+i1)>>1;
    if (t < array[i]) {
      i1 = i;
      while (array[i1] == array[i1-1]) i1--;
    }
    else {
      i0 = i;
      while (array[i0] == array[i0+1]) i0++;
    }
  }

  return i0;
}